

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O2

void * readwrite_routine(void *arg)

{
  byte *__s1;
  int __fd;
  int iVar1;
  in_addr iVar2;
  uint *puVar3;
  stCoEpoll_t *ctx;
  ssize_t sVar4;
  in_addr_t iVar5;
  uint uVar6;
  int error;
  uint32_t socklen;
  pollfd local_4050;
  sockaddr_in addr;
  char buf [16384];
  
  co_enable_hook_sys();
  __fd = -1;
  do {
    while (-1 < __fd) {
LAB_0010485b:
      sVar4 = write(__fd,"sarlmol",8);
      if (((int)sVar4 < 1) || (sVar4 = read(__fd,buf,0x4000), (int)sVar4 < 1)) {
        close(__fd);
        AddFailCnt();
        __fd = -1;
      }
      else {
        AddSuccCnt();
      }
    }
    iVar5 = 0;
    __fd = socket(2,1,0);
    __s1 = *arg;
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
    addr.sin_addr.s_addr = 0;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    addr.sin_family = 2;
    addr.sin_port = *(ushort *)((long)arg + 8) << 8 | *(ushort *)((long)arg + 8) >> 8;
    iVar2.s_addr = iVar5;
    if (((((__s1 != (byte *)0x0) && (uVar6 = (uint)*__s1, iVar2.s_addr = uVar6, *__s1 != 0)) &&
         ((uVar6 != 0x30 || (iVar2.s_addr = iVar5, __s1[1] != 0)))) &&
        (iVar1 = strcmp((char *)__s1,"0.0.0.0"), iVar2.s_addr = iVar5, iVar1 != 0)) &&
       ((uVar6 != 0x2a || (iVar2.s_addr = 0, __s1[1] != 0)))) {
      iVar2.s_addr = inet_addr((char *)__s1);
    }
    addr.sin_addr.s_addr = iVar2.s_addr;
    connect(__fd,(sockaddr *)&addr,0x10);
    puVar3 = (uint *)__errno_location();
    if ((*puVar3 & 0xfffffffe) != 0x72) goto LAB_0010485b;
    local_4050.events = 0x1c;
    local_4050.revents = 0;
    local_4050.fd = __fd;
    ctx = co_get_epoll_ct();
    co_poll(ctx,&local_4050,1,200);
    error = 0;
    socklen = 4;
    *puVar3 = 0;
    iVar1 = getsockopt(__fd,1,4,&error,&socklen);
    if (iVar1 != -1) {
      if (error == 0) goto LAB_0010485b;
      *puVar3 = error;
    }
    close(__fd);
    AddFailCnt();
    __fd = -1;
  } while( true );
}

Assistant:

static void *readwrite_routine( void *arg )
{

	co_enable_hook_sys();

	stEndPoint *endpoint = (stEndPoint *)arg;
	char str[8]="sarlmol";
	char buf[ 1024 * 16 ];
	int fd = -1;
	int ret = 0;
	for(;;)
	{
		if ( fd < 0 )
		{
			fd = socket(PF_INET, SOCK_STREAM, 0);
			struct sockaddr_in addr;
			SetAddr(endpoint->ip, endpoint->port, addr);
			ret = connect(fd,(struct sockaddr*)&addr,sizeof(addr));
						
			if ( errno == EALREADY || errno == EINPROGRESS )
			{       
				struct pollfd pf = { 0 };
				pf.fd = fd;
				pf.events = (POLLOUT|POLLERR|POLLHUP);
				co_poll( co_get_epoll_ct(),&pf,1,200);
				//check connect
				int error = 0;
				uint32_t socklen = sizeof(error);
				errno = 0;
				ret = getsockopt(fd, SOL_SOCKET, SO_ERROR,(void *)&error,  &socklen);
				if ( ret == -1 ) 
				{       
					//printf("getsockopt ERROR ret %d %d:%s\n", ret, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
				if ( error ) 
				{       
					errno = error;
					//printf("connect ERROR ret %d %d:%s\n", error, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
			} 
	  			
		}
		
		ret = write( fd,str, 8);
		if ( ret > 0 )
		{
			ret = read( fd,buf, sizeof(buf) );
			if ( ret <= 0 )
			{
				//printf("co %p read ret %d errno %d (%s)\n",
				//		co_self(), ret,errno,strerror(errno));
				close(fd);
				fd = -1;
				AddFailCnt();
			}
			else
			{
				//printf("echo %s fd %d\n", buf,fd);
				AddSuccCnt();
			}
		}
		else
		{
			//printf("co %p write ret %d errno %d (%s)\n",
			//		co_self(), ret,errno,strerror(errno));
			close(fd);
			fd = -1;
			AddFailCnt();
		}
	}
	return 0;
}